

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_exception_primitive_ensure
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_stackFrameCleanupRecord_t cleanUpRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.result = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 1;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  cleanUpRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  cleanUpRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
  cleanUpRecord.action = arguments[1];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&cleanUpRecord);
  gcFrame.result = sysbvm_function_apply0(context,*arguments);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&cleanUpRecord);
  sysbvm_function_apply0(context,cleanUpRecord.action);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_ensure(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *body = arguments + 0;
    sysbvm_tuple_t *block = arguments + 1;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameCleanupRecord_t cleanUpRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP,
        .action = *block,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    gcFrame.result = sysbvm_function_apply0(context, *body);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&cleanUpRecord);

    sysbvm_function_apply0(context, cleanUpRecord.action);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}